

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool camp::test::array::greater_than_or_equal(void)

{
  bool bVar1;
  byte local_19;
  array<int,_2UL> local_18;
  array<int,_2UL> b;
  array<int,_2UL> a;
  
  b.elements[0] = 1;
  b.elements[1] = 2;
  local_18.elements[0] = 1;
  local_18.elements[1] = 3;
  bVar1 = operator>=(&b,&b);
  local_19 = 0;
  if (bVar1) {
    bVar1 = operator>=(&local_18,&b);
    local_19 = 0;
    if (bVar1) {
      bVar1 = operator>=(&b,&local_18);
      local_19 = bVar1 ^ 0xff;
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

CAMP_TEST_BEGIN(array, greater_than_or_equal)
{
   camp::array<int, 2> a{1, 2};
   camp::array<int, 2> b{1, 3};

   return a >= a &&
          b >= a &&
          !(a >= b);
}